

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O0

void __thiscall zmq::socks_connecter_t::set_auth_method_none(socks_connecter_t *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0xb48) = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void zmq::socks_connecter_t::set_auth_method_none ()
{
    _auth_method = socks_no_auth_required;
    _auth_username.clear ();
    _auth_password.clear ();
}